

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O3

int SaveEnv(void)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar2;
  interval *piVar3;
  long lVar4;
  char line [1024];
  byte local_438;
  char local_437;
  
  memset(&local_438,0,0x400);
  __stream = fopen("env.txt","r");
  if (__stream == (FILE *)0x0) {
LAB_0014d230:
    puts("Error saving configuration file.");
  }
  else {
    __stream_00 = fopen("~env.txt","w");
    if (__stream_00 != (FILE *)0x0) {
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014c3ac:
              if (pcVar2 != (char *)0x0) goto LAB_0014c3bd;
            }
            break;
          }
LAB_0014c37a:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014c37a;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014c3ac;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : (M_PI/2.0-angle_env)*180.0/M_PI.");
LAB_0014c3bd:
      iVar1 = fprintf(__stream_00,"%.10g\n",
                      ((1.5707963267948966 - angle_env) * 180.0) / 3.141592653589793);
      if (iVar1 < 0) {
        puts("Error writing parameter : (M_PI/2.0-angle_env)*180.0/M_PI.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014c473:
              if (pcVar2 != (char *)0x0) goto LAB_0014c484;
            }
            break;
          }
LAB_0014c441:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014c441;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014c473;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : lat_env.");
LAB_0014c484:
      iVar1 = fprintf(__stream_00,"%.10g\n",lat_env);
      if (iVar1 < 0) {
        puts("Error writing parameter : lat_env.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014c522:
              if (pcVar2 != (char *)0x0) goto LAB_0014c533;
            }
            break;
          }
LAB_0014c4f0:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014c4f0;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014c522;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : long_env.");
LAB_0014c533:
      iVar1 = fprintf(__stream_00,"%.10g\n",long_env);
      if (iVar1 < 0) {
        puts("Error writing parameter : long_env.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014c5d1:
              if (pcVar2 != (char *)0x0) goto LAB_0014c5e2;
            }
            break;
          }
LAB_0014c59f:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014c59f;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014c5d1;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : alt_env.");
LAB_0014c5e2:
      iVar1 = fprintf(__stream_00,"%.10g\n",alt_env);
      if (iVar1 < 0) {
        puts("Error writing parameter : alt_env.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014c680:
              if (pcVar2 != (char *)0x0) goto LAB_0014c691;
            }
            break;
          }
LAB_0014c64e:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014c64e;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014c680;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : MagneticDeclination.");
LAB_0014c691:
      iVar1 = fprintf(__stream_00,"%.10g\n",MagneticDeclination);
      if (iVar1 < 0) {
        puts("Error writing parameter : MagneticDeclination.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014c72f:
              if (pcVar2 != (char *)0x0) goto LAB_0014c740;
            }
            break;
          }
LAB_0014c6fd:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014c6fd;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014c72f;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : AirPressure.");
LAB_0014c740:
      iVar1 = fprintf(__stream_00,"%.10g\n",AirPressure);
      if (iVar1 < 0) {
        puts("Error writing parameter : AirPressure.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014c7de:
              if (pcVar2 != (char *)0x0) goto LAB_0014c7ef;
            }
            break;
          }
LAB_0014c7ac:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014c7ac;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014c7de;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : WaterVelocityOfSound.");
LAB_0014c7ef:
      iVar1 = fprintf(__stream_00,"%.10g\n",WaterVelocityOfSound);
      if (iVar1 < 0) {
        puts("Error writing parameter : WaterVelocityOfSound.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014c88d:
              if (pcVar2 != (char *)0x0) goto LAB_0014c89e;
            }
            break;
          }
LAB_0014c85b:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014c85b;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014c88d;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : WaterFloorAltitude.");
LAB_0014c89e:
      iVar1 = fprintf(__stream_00,"%.10g\n",WaterFloorAltitude);
      if (iVar1 < 0) {
        puts("Error writing parameter : WaterFloorAltitude.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014c93c:
              if (pcVar2 != (char *)0x0) goto LAB_0014c94d;
            }
            break;
          }
LAB_0014c90a:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014c90a;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014c93c;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : (int)circles_r.size().");
LAB_0014c94d:
      iVar1 = fprintf(__stream_00,"%d\n",
                      (ulong)((long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar1 < 0) {
        puts("Error writing parameter : (int)circles_r.size().");
      }
      if (0 < (int)((ulong)((long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar4 = 0;
LAB_0014c9a4:
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014c9da;
          if (local_438 != 0x24) goto LAB_0014ca0c;
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
        }
        else {
          if (local_438 != 0x25) {
            if (((local_438 == 0x2f) && (pcVar2 != (char *)0x0)) && (local_437 == '/'))
            goto LAB_0014c9df;
LAB_0014ca0c:
            if (pcVar2 == (char *)0x0) goto LAB_0014ca11;
            goto LAB_0014ca1d;
          }
LAB_0014c9da:
          if (pcVar2 != (char *)0x0) {
LAB_0014c9df:
            iVar1 = fprintf(__stream_00,"%s",&local_438);
            if (iVar1 < 0) goto LAB_0014ca11;
            goto LAB_0014c9a4;
          }
        }
LAB_0014ca11:
        puts("Invalid parameter : circles.");
LAB_0014ca1d:
        iVar1 = fprintf(__stream_00,"%.10g %.10g %.10g\n",
                        circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4],
                        circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4],
                        circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4]);
        if (iVar1 < 0) {
          puts("Error writing parameter : circles.");
        }
        lVar4 = lVar4 + 1;
        if ((int)((ulong)((long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3) <= lVar4) goto LAB_0014ca8d;
        goto LAB_0014c9a4;
      }
LAB_0014ca8d:
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014caf5:
              if (pcVar2 != (char *)0x0) goto LAB_0014cb06;
            }
            break;
          }
LAB_0014cac3:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014cac3;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014caf5;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : (int)walls_xa.size().");
LAB_0014cb06:
      iVar1 = fprintf(__stream_00,"%d\n",
                      (ulong)((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar1 < 0) {
        puts("Error writing parameter : (int)walls_xa.size().");
      }
      if (0 < (int)((ulong)((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar4 = 0;
LAB_0014cb5d:
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014cb93;
          if (local_438 != 0x24) goto LAB_0014cbc5;
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
        }
        else {
          if (local_438 != 0x25) {
            if (((local_438 == 0x2f) && (pcVar2 != (char *)0x0)) && (local_437 == '/'))
            goto LAB_0014cb98;
LAB_0014cbc5:
            if (pcVar2 == (char *)0x0) goto LAB_0014cbca;
            goto LAB_0014cbd6;
          }
LAB_0014cb93:
          if (pcVar2 != (char *)0x0) {
LAB_0014cb98:
            iVar1 = fprintf(__stream_00,"%s",&local_438);
            if (iVar1 < 0) goto LAB_0014cbca;
            goto LAB_0014cb5d;
          }
        }
LAB_0014cbca:
        puts("Invalid parameter : walls.");
LAB_0014cbd6:
        iVar1 = fprintf(__stream_00,"%.10g %.10g %.10g %.10g\n",
                        walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4],
                        walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4],
                        walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4],
                        walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4]);
        if (iVar1 < 0) {
          puts("Error writing parameter : walls.");
        }
        lVar4 = lVar4 + 1;
        if ((int)((ulong)((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                         (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3) <= lVar4) goto LAB_0014cc56;
        goto LAB_0014cb5d;
      }
LAB_0014cc56:
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014ccbe:
              if (pcVar2 != (char *)0x0) goto LAB_0014cccf;
            }
            break;
          }
LAB_0014cc8c:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014cc8c;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014ccbe;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : box_env[0].inf.");
LAB_0014cccf:
      piVar3 = box::operator[](&box_env,0);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar3->inf);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[0].inf.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014cd74:
              if (pcVar2 != (char *)0x0) goto LAB_0014cd85;
            }
            break;
          }
LAB_0014cd42:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014cd42;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014cd74;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : box_env[0].sup.");
LAB_0014cd85:
      piVar3 = box::operator[](&box_env,0);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar3->sup);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[0].sup.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014ce2b:
              if (pcVar2 != (char *)0x0) goto LAB_0014ce3c;
            }
            break;
          }
LAB_0014cdf9:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014cdf9;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014ce2b;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : box_env[1].inf.");
LAB_0014ce3c:
      piVar3 = box::operator[](&box_env,1);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar3->inf);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[1].inf.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014cee4:
              if (pcVar2 != (char *)0x0) goto LAB_0014cef5;
            }
            break;
          }
LAB_0014ceb2:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014ceb2;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014cee4;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : box_env[1].sup.");
LAB_0014cef5:
      piVar3 = box::operator[](&box_env,1);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar3->sup);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[1].sup.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014cf9e:
              if (pcVar2 != (char *)0x0) goto LAB_0014cfaf;
            }
            break;
          }
LAB_0014cf6c:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014cf6c;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014cf9e;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : csMap.xMin.");
LAB_0014cfaf:
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMin);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMin.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014d04f:
              if (pcVar2 != (char *)0x0) goto LAB_0014d060;
            }
            break;
          }
LAB_0014d01d:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014d01d;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014d04f;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : csMap.xMax.");
LAB_0014d060:
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMax);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMax.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014d0f9:
              if (pcVar2 != (char *)0x0) goto LAB_0014d10a;
            }
            break;
          }
LAB_0014d0c7:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014d0c7;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014d0f9;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : csMap.xMin.");
LAB_0014d10a:
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMin);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMin.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 != 0x23) {
            if (local_438 == 0x24) {
              if (pcVar2 != (char *)0x0) {
                fputs((char *)&local_438,__stream_00);
              }
            }
            else {
LAB_0014d1a3:
              if (pcVar2 != (char *)0x0) goto LAB_0014d1b4;
            }
            break;
          }
LAB_0014d171:
          if (pcVar2 == (char *)0x0) break;
        }
        else {
          if (local_438 == 0x25) goto LAB_0014d171;
          if (((local_438 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_437 != '/'))
          goto LAB_0014d1a3;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      puts("Invalid parameter : csMap.xMax.");
LAB_0014d1b4:
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMax);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMax.");
      }
      iVar1 = fclose(__stream_00);
      if (iVar1 == 0) {
        iVar1 = fclose(__stream);
        if (((iVar1 == 0) && (iVar1 = remove("env.txt"), iVar1 == 0)) &&
           (iVar1 = rename("~env.txt","env.txt"), iVar1 == 0)) {
          return 0;
        }
        goto LAB_0014d230;
      }
    }
    puts("Error saving configuration file.");
    fclose(__stream);
  }
  return 1;
}

Assistant:

inline int SaveEnv(void)
{
	FILE* filein = NULL;
	FILE* fileout = NULL;
	char line[1024];
	int i = 0;

	// Missing error checking...

	memset(line, 0, sizeof(line));

	filein = fopen("env.txt", "r");
	if (filein == NULL)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}
	fileout = fopen("~env.txt", "w");
	if (fileout == NULL)
	{
		printf("Error saving configuration file.\n");
		fclose(filein);
		return EXIT_FAILURE;
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");
	if (fprintf(fileout, "%.10g\n", (M_PI/2.0-angle_env)*180.0/M_PI) < 0) printf("Error writing parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : lat_env.\n");
	if (fprintf(fileout, "%.10g\n", lat_env) < 0) printf("Error writing parameter : lat_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : long_env.\n");
	if (fprintf(fileout, "%.10g\n", long_env) < 0) printf("Error writing parameter : long_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : alt_env.\n");
	if (fprintf(fileout, "%.10g\n", alt_env) < 0) printf("Error writing parameter : alt_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : MagneticDeclination.\n");
	if (fprintf(fileout, "%.10g\n", MagneticDeclination) < 0) printf("Error writing parameter : MagneticDeclination.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : AirPressure.\n");
	if (fprintf(fileout, "%.10g\n", AirPressure) < 0) printf("Error writing parameter : AirPressure.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : WaterVelocityOfSound.\n");
	if (fprintf(fileout, "%.10g\n", WaterVelocityOfSound) < 0) printf("Error writing parameter : WaterVelocityOfSound.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : WaterFloorAltitude.\n");
	if (fprintf(fileout, "%.10g\n", WaterFloorAltitude) < 0) printf("Error writing parameter : WaterFloorAltitude.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (int)circles_r.size().\n");
	if (fprintf(fileout, "%d\n", (int)circles_r.size()) < 0) printf("Error writing parameter : (int)circles_r.size().\n");
	for (i = 0; i < (int)circles_r.size(); i++)
	{
		if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : circles.\n");
		if (fprintf(fileout, "%.10g %.10g %.10g\n", circles_x[i], circles_y[i], circles_r[i]) < 0) printf("Error writing parameter : circles.\n");
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (int)walls_xa.size().\n");
	if (fprintf(fileout, "%d\n", (int)walls_xa.size()) < 0) printf("Error writing parameter : (int)walls_xa.size().\n");
	for (i = 0; i < (int)walls_xa.size(); i++)
	{
		if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : walls.\n");
		if (fprintf(fileout, "%.10g %.10g %.10g %.10g\n", walls_xa[i], walls_ya[i], walls_xb[i], walls_yb[i]) < 0) printf("Error writing parameter : walls.\n");
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[0].inf.\n");
	if (fprintf(fileout, "%.10g\n", box_env[0].inf) < 0) printf("Error writing parameter : box_env[0].inf.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[0].sup.\n");
	if (fprintf(fileout, "%.10g\n", box_env[0].sup) < 0) printf("Error writing parameter : box_env[0].sup.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[1].inf.\n");
	if (fprintf(fileout, "%.10g\n", box_env[1].inf) < 0) printf("Error writing parameter : box_env[1].inf.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[1].sup.\n");
	if (fprintf(fileout, "%.10g\n", box_env[1].sup) < 0) printf("Error writing parameter : box_env[1].sup.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMin.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMin) < 0) printf("Error writing parameter : csMap.xMin.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMax.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMax) < 0) printf("Error writing parameter : csMap.xMax.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMin.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMin) < 0) printf("Error writing parameter : csMap.xMin.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMax.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMax) < 0) printf("Error writing parameter : csMap.xMax.\n");

	if (fclose(fileout) != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		fclose(filein);
		return EXIT_FAILURE;
	}
	if (fclose(filein) != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}

	if (remove("env.txt") != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}
	if (rename("~env.txt", "env.txt") != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}